

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O1

void test_archive_read_support(void)

{
  long lVar1;
  
  test_filter_or_format(archive_read_support_format_7zip);
  test_filter_or_format(archive_read_support_format_all);
  test_filter_or_format(archive_read_support_format_ar);
  test_filter_or_format(archive_read_support_format_cab);
  test_filter_or_format(archive_read_support_format_cpio);
  test_filter_or_format(archive_read_support_format_empty);
  test_filter_or_format(archive_read_support_format_iso9660);
  test_filter_or_format(archive_read_support_format_lha);
  test_filter_or_format(archive_read_support_format_mtree);
  test_filter_or_format(archive_read_support_format_tar);
  test_filter_or_format(archive_read_support_format_xar);
  test_filter_or_format(archive_read_support_format_zip);
  lVar1 = 0;
  do {
    format_code = *(int *)((long)&DAT_002a1b00 + lVar1);
    test_filter_or_format(format_code_enabler);
    test_filter_or_format(format_code_setter);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x70);
  test_filter_or_format(archive_read_support_filter_all);
  test_filter_or_format(archive_read_support_filter_bzip2);
  test_filter_or_format(archive_read_support_filter_compress);
  test_filter_or_format(archive_read_support_filter_gzip);
  test_filter_or_format(archive_read_support_filter_lzip);
  test_filter_or_format(archive_read_support_filter_lzma);
  test_filter_or_format(archive_read_support_filter_none);
  test_filter_or_format(archive_read_support_filter_rpm);
  test_filter_or_format(archive_read_support_filter_uu);
  test_filter_or_format(archive_read_support_filter_xz);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_support)
{
	test_filter_or_format(archive_read_support_format_7zip);
	test_filter_or_format(archive_read_support_format_all);
	test_filter_or_format(archive_read_support_format_ar);
	test_filter_or_format(archive_read_support_format_cab);
	test_filter_or_format(archive_read_support_format_cpio);
	test_filter_or_format(archive_read_support_format_empty);
	test_filter_or_format(archive_read_support_format_iso9660);
	test_filter_or_format(archive_read_support_format_lha);
	test_filter_or_format(archive_read_support_format_mtree);
	test_filter_or_format(archive_read_support_format_tar);
	test_filter_or_format(archive_read_support_format_xar);
	test_filter_or_format(archive_read_support_format_zip);

	int format_codes[] = {
	    ARCHIVE_FORMAT_CPIO,
	    ARCHIVE_FORMAT_CPIO_POSIX,
	    ARCHIVE_FORMAT_CPIO_BIN_LE,
	    ARCHIVE_FORMAT_CPIO_BIN_BE,
	    ARCHIVE_FORMAT_CPIO_SVR4_NOCRC,
	    ARCHIVE_FORMAT_CPIO_SVR4_CRC,
	    ARCHIVE_FORMAT_CPIO_AFIO_LARGE,
	    ARCHIVE_FORMAT_TAR,
	    ARCHIVE_FORMAT_TAR_USTAR,
	    ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE,
	    ARCHIVE_FORMAT_TAR_PAX_RESTRICTED,
	    ARCHIVE_FORMAT_TAR_GNUTAR,
	    ARCHIVE_FORMAT_ISO9660,
	    ARCHIVE_FORMAT_ISO9660_ROCKRIDGE,
	    ARCHIVE_FORMAT_ZIP,
	    ARCHIVE_FORMAT_EMPTY,
	    ARCHIVE_FORMAT_AR,
	    ARCHIVE_FORMAT_AR_GNU,
	    ARCHIVE_FORMAT_AR_BSD,
	    ARCHIVE_FORMAT_MTREE,
	    ARCHIVE_FORMAT_RAW,
	    ARCHIVE_FORMAT_XAR,
	    ARCHIVE_FORMAT_LHA,
	    ARCHIVE_FORMAT_CAB,
	    ARCHIVE_FORMAT_RAR,
	    ARCHIVE_FORMAT_7ZIP,
	    ARCHIVE_FORMAT_WARC,
	    ARCHIVE_FORMAT_RAR_V5,
	};
	unsigned int i;

	for (i = 0; i < sizeof(format_codes) / sizeof(int); i++) {
		format_code = format_codes[i];
		test_filter_or_format(format_code_enabler);
		test_filter_or_format(format_code_setter);
	}

	test_filter_or_format(archive_read_support_filter_all);
	test_filter_or_format(archive_read_support_filter_bzip2);
	test_filter_or_format(archive_read_support_filter_compress);
	test_filter_or_format(archive_read_support_filter_gzip);
	test_filter_or_format(archive_read_support_filter_lzip);
	test_filter_or_format(archive_read_support_filter_lzma);
	test_filter_or_format(archive_read_support_filter_none);
	test_filter_or_format(archive_read_support_filter_rpm);
	test_filter_or_format(archive_read_support_filter_uu);
	test_filter_or_format(archive_read_support_filter_xz);
}